

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase(MatcherUntypedBase *this)

{
  code *pcVar1;
  MatcherUntypedBase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

MatcherUntypedBase::~MatcherUntypedBase() = default;